

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

void tb_invalidate_phys_page_fast_arm
               (uc_struct_conflict1 *uc,page_collection *pages,tb_page_addr_t start,int len,
               uintptr_t retaddr)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  PageDesc *pages_00;
  unsigned_long *puVar4;
  PageDesc *pPVar5;
  uint uVar6;
  uint uVar7;
  uintptr_t in_R9;
  uint *puVar8;
  
  pages_00 = page_find(uc,start >> ((byte)uc->init_target_page->bits & 0x3f));
  if (pages_00 != (PageDesc *)0x0) {
    puVar4 = pages_00->code_bitmap;
    if (puVar4 == (unsigned_long *)0x0) {
      uVar6 = pages_00->code_write_count + 1;
      pages_00->code_write_count = uVar6;
      if (uVar6 < 10) goto LAB_0052740f;
      puVar4 = (unsigned_long *)
               g_try_malloc0(0x3fU - (long)uc->init_target_page->mask >> 3 & 0xfffffffffffffff8);
      if (puVar4 == (unsigned_long *)0x0) {
        abort();
      }
      pages_00->code_bitmap = puVar4;
      pPVar5 = pages_00;
      while( true ) {
        uVar2 = pPVar5->first_tb;
        puVar8 = (uint *)(uVar2 & 0xfffffffffffffffe);
        if (puVar8 == (uint *)0x0) break;
        if ((uVar2 & 1) == 0) {
          uVar1 = uc->init_target_page->mask;
          uVar3 = *puVar8 & ~uVar1;
          uVar7 = (ushort)puVar8[3] + uVar3;
          uVar6 = -uVar1;
          if (SBORROW4(uVar7,-uVar1) != (int)(uVar7 + uVar1) < 0) {
            uVar6 = uVar7;
          }
        }
        else {
          uVar3 = 0;
          uVar6 = ~uc->init_target_page->mask & *puVar8 + (uint)(ushort)puVar8[3];
        }
        qemu_bitmap_set(pages_00->code_bitmap,(long)(int)uVar3,(long)(int)(uVar6 - uVar3));
        pPVar5 = (PageDesc *)(puVar8 + (ulong)((uint)uVar2 & 1) * 2 + 0xc);
      }
      puVar4 = pages_00->code_bitmap;
      if (puVar4 == (unsigned_long *)0x0) goto LAB_0052740f;
    }
    uVar6 = (uint)start & ~uc->init_target_page->mask;
    if (((uint)(puVar4[uVar6 >> 6] >> ((byte)uVar6 & 0x3f)) & ~(-1 << ((byte)len & 0x1f))) != 0) {
LAB_0052740f:
      tb_invalidate_phys_page_range__locked
                (uc,(page_collection *)pages_00,(PageDesc *)start,(long)len + start,retaddr,in_R9);
      return;
    }
  }
  return;
}

Assistant:

void tb_invalidate_phys_page_fast(struct uc_struct *uc, struct page_collection *pages,
                                  tb_page_addr_t start, int len,
                                  uintptr_t retaddr)
{
    PageDesc *p;

    assert_memory_lock();

    p = page_find(uc, start >> TARGET_PAGE_BITS);
    if (!p) {
        return;
    }

    assert_page_locked(p);
    if (!p->code_bitmap &&
        ++p->code_write_count >= SMC_BITMAP_USE_THRESHOLD) {
        build_page_bitmap(uc, p);
    }
    if (p->code_bitmap) {
        unsigned int nr;
        unsigned long b;

        nr = start & ~TARGET_PAGE_MASK;
        b = p->code_bitmap[BIT_WORD(nr)] >> (nr & (BITS_PER_LONG - 1));
        if (b & ((1 << len) - 1)) {
            goto do_invalidate;
        }
    } else {
    do_invalidate:
        tb_invalidate_phys_page_range__locked(uc, pages, p, start, start + len,
                                              retaddr);
    }
}